

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall Json::BuiltStyledStreamWriter::writeIndent(BuiltStyledStreamWriter *this)

{
  ulong uVar1;
  ostream *poVar2;
  long in_RDI;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    poVar2 = std::operator<<(*(ostream **)(in_RDI + 8),'\n');
    std::operator<<(poVar2,(string *)(in_RDI + 0x28));
  }
  return;
}

Assistant:

void BuiltStyledStreamWriter::writeIndent() {
  // blep intended this to look at the so-far-written string
  // to determine whether we are already indented, but
  // with a stream we cannot do that. So we rely on some saved state.
  // The caller checks indented_.

  if (!indentation_.empty()) {
    // In this case, drop newlines too.
    *sout_ << '\n' << indentString_;
  }
}